

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_mul.c
# Opt level: O1

int main(void)

{
  int iVar1;
  _PDCLIB_bigint_t result;
  _PDCLIB_bigint_t rhs;
  _PDCLIB_bigint_t lhs;
  _PDCLIB_bigint_t expected;
  _PDCLIB_bigint_t _Stack_238;
  _PDCLIB_bigint_t local_1b0;
  _PDCLIB_bigint_t local_128;
  _PDCLIB_bigint_t local_a0;
  
  _PDCLIB_bigint32(&local_128,0);
  _PDCLIB_bigint32(&local_1b0,0);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  if (_Stack_238.size != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x53,"result.size == 0");
  }
  _PDCLIB_bigint32(&local_1b0,1);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  if (_Stack_238.size != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x58,"result.size == 0");
  }
  _PDCLIB_bigint32(&local_128,2);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  _PDCLIB_bigint32(&local_a0,2);
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x5e,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  _PDCLIB_bigint64(&local_1b0,1,0);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  _PDCLIB_bigint64(&local_a0,2,0);
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,100,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  _PDCLIB_bigint32(&local_1b0,0x80000000);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  _PDCLIB_bigint64(&local_a0,1,0);
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x6a,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  _PDCLIB_bigint(&local_1b0,&_Stack_238);
  _PDCLIB_bigint(&local_128,&_Stack_238);
  local_128.data[0] = 1;
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  _PDCLIB_bigint64(&local_a0,1,1);
  _PDCLIB_bigint_shl(&local_a0,0x20);
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x73,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  _PDCLIB_bigint(&local_128,&_Stack_238);
  local_128.data[0] = 1;
  _PDCLIB_bigint32(&local_1b0,0xffffffff);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  _PDCLIB_bigint64(&local_a0,0xffffffff,0xffffffff);
  _PDCLIB_bigint_shl(&local_a0,0x20);
  _PDCLIB_bigint_add(&local_a0,&local_1b0);
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x7d,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  _PDCLIB_bigint(&local_1b0,&_Stack_238);
  _PDCLIB_bigint(&local_128,&_Stack_238);
  _PDCLIB_bigint_mul(&_Stack_238,&local_128,&local_1b0);
  local_a0.data[0] = local_a0.data[0] - 1;
  _PDCLIB_bigint_shl(&local_a0,0x60);
  local_a0.data[0] = 1;
  iVar1 = _PDCLIB_bigint_cmp(&_Stack_238,&local_a0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mul.c, line %d - %s\n"
           ,0x86,"_PDCLIB_bigint_cmp( &result, &expected ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t lhs, rhs, result, expected;

    /* 0 x 0 = 0 */
    _PDCLIB_bigint32( &lhs, 0 );
    _PDCLIB_bigint32( &rhs, 0 );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    TESTCASE( result.size == 0 );

    /* 0 x 1 = 0 */
    _PDCLIB_bigint32( &rhs, 1 );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    TESTCASE( result.size == 0 );

    /* 2 x 1 = 2 */
    _PDCLIB_bigint32( &lhs, 2 );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    _PDCLIB_bigint32( &expected, 2 );
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );

    /* 2 x 10 = 20 */
    _PDCLIB_bigint64( &rhs, 1, 0 );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    _PDCLIB_bigint64( &expected, 2, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );

    /* 2 x 5 = 10 */
    _PDCLIB_bigint32( &rhs, UINT32_C( 0x80000000 ) );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    _PDCLIB_bigint64( &expected, 1, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );

    /* 11 x 10 = 110 */
    _PDCLIB_bigint( &rhs, &result );
    _PDCLIB_bigint( &lhs, &result );
    lhs.data[0] = 1;
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    _PDCLIB_bigint64( &expected, 1, 1 );
    _PDCLIB_bigint_shl( &expected, 32 );
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );

    /* 111 x 9 = 999 */
    _PDCLIB_bigint( &lhs, &result );
    lhs.data[0] = 1;
    _PDCLIB_bigint32( &rhs, UINT32_C( 0xFFFFFFFF ) );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    _PDCLIB_bigint64( &expected, UINT32_C( 0xFFFFFFFF ), UINT32_C( 0xFFFFFFFF ) );
    _PDCLIB_bigint_shl( &expected, 32 );
    _PDCLIB_bigint_add( &expected, &rhs );
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );

    /* 999 x 999 = 998001 */
    _PDCLIB_bigint( &rhs, &result );
    _PDCLIB_bigint( &lhs, &result );
    _PDCLIB_bigint_mul( &result, &lhs, &rhs );
    --expected.data[0];
    _PDCLIB_bigint_shl( &expected, 96 );
    expected.data[0] = 1;
    TESTCASE( _PDCLIB_bigint_cmp( &result, &expected ) == 0 );
#endif
    return TEST_RESULTS;
}